

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_perlin_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int offset_x,int offset_y,
          float scale,rf_color *dst,rf_int dst_size)

{
  int iVar1;
  float fVar2;
  undefined4 uStack_54;
  rf_color local_4c;
  int intensity;
  float p;
  float ny;
  float nx;
  rf_int x;
  rf_int y;
  rf_color *dst_local;
  float scale_local;
  int offset_y_local;
  int offset_x_local;
  int height_local;
  int width_local;
  
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  if (width * height * iVar1 <= dst_size) {
    for (x = 0; x < height; x = x + 1) {
      for (_ny = 0; _ny < width; _ny = _ny + 1) {
        fVar2 = stb_perlin_fbm_noise3
                          (((float)(_ny + offset_x) * scale) / (float)width,
                           ((float)(x + offset_y) * scale) / (float)height,1.0,2.0,0.5,6);
        local_4c.g = (uchar)(int)(((fVar2 + 1.0) / 2.0) * 255.0);
        local_4c.r = local_4c.g;
        local_4c.b = local_4c.g;
        local_4c.a = 0xff;
        dst[x * width + _ny] = local_4c;
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_54._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_perlin_noise_to_buffer(int width, int height, int offset_x, int offset_y, float scale, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float nx = (float)(x + offset_x)*scale/(float)width;
                float ny = (float)(y + offset_y)*scale/(float)height;

                // Typical values to start playing with:
                //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
                //   gain       =  0.5   -- relative weighting applied to each successive octave
                //   octaves    =  6     -- number of "octaves" of noise3() to sum

                // NOTE: We need to translate the data from [-1..1] to [0..1]
                float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f) / 2.0f;

                int intensity = (int)(p * 255.0f);
                dst[y * width + x] = (rf_color){ intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}